

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O0

complex<double> __thiscall dlib::rand::get_random_complex_gaussian(rand *this)

{
  uint uVar1;
  uint32 uVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  complex<double> cVar12;
  double rnd2;
  double rnd1;
  double rndmax;
  double w;
  double x2;
  double x1;
  complex<double> local_10;
  
  auVar7 = in_ZMM0._0_16_;
  uVar1 = std::numeric_limits<unsigned_int>::max();
  auVar7 = vcvtusi2sd_avx512f(auVar7,uVar1);
  do {
    uVar2 = get_random_32bit_number((rand *)0x27ecae);
    auVar7 = vcvtusi2sd_avx512f(auVar7,uVar2);
    auVar5._0_8_ = auVar7._0_8_ / 4294967295.0;
    auVar5._8_8_ = auVar7._8_8_;
    auVar7 = auVar5;
    uVar2 = get_random_32bit_number((rand *)0x27ecd0);
    auVar7 = vcvtusi2sd_avx512f(auVar7,uVar2);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = auVar5._0_8_;
    auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar8,ZEXT816(0xbff0000000000000));
    auVar6._0_8_ = auVar5._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar7._0_8_ / 4294967295.0;
    auVar7 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar9,ZEXT816(0xbff0000000000000));
    dVar3 = auVar7._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar6._0_8_;
    auVar6._8_8_ = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar3 * dVar3;
    auVar7 = vfmadd213sd_fma(auVar6,auVar10,auVar11);
    auVar7._8_8_ = 0;
  } while (1.0 <= auVar7._0_8_);
  dVar4 = log(auVar7._0_8_);
  dVar4 = sqrt((dVar4 * -2.0) / auVar7._0_8_);
  std::complex<double>::complex(&local_10,auVar6._0_8_ * dVar4,dVar3 * dVar4);
  cVar12._M_value._8_8_ = extraout_RDX;
  cVar12._M_value._0_8_ = extraout_RAX;
  return (complex<double>)cVar12._M_value;
}

Assistant:

std::complex<double> get_random_complex_gaussian (
            )
            {
                double x1, x2, w;

                const double rndmax = std::numeric_limits<dlib::uint32>::max();

                // Generate a pair of Gaussian random numbers using the Box-Muller transformation.
                do 
                {
                    const double rnd1 = get_random_32bit_number()/rndmax;
                    const double rnd2 = get_random_32bit_number()/rndmax;

                    x1 = 2.0 * rnd1 - 1.0;
                    x2 = 2.0 * rnd2 - 1.0;
                    w = x1 * x1 + x2 * x2;
                } while ( w >= 1.0 );

                w = std::sqrt( (-2.0 * std::log( w ) ) / w );
                return std::complex<double>(x1 * w, x2 * w);
            }